

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

BOOL __thiscall
Js::JavascriptArray::GetDiagValueString
          (JavascriptArray *this,StringBuilder<Memory::ArenaAllocator> *stringBuilder,
          ScriptContext *requestContext)

{
  ScriptContext *__localScriptContext;
  void *unaff_retaddr;
  undefined1 auStack_a8 [8];
  ScriptEntryExitRecord __entryExitRecord;
  EnterScriptObject __enterScriptObject;
  anon_class_24_3_ff518c6f funcPtr;
  ScriptContext *requestContext_local;
  StringBuilder<Memory::ArenaAllocator> *stringBuilder_local;
  
  funcPtr.stringBuilder = (StringBuilder<Memory::ArenaAllocator> **)requestContext;
  requestContext_local = (ScriptContext *)stringBuilder;
  StringBuilder<Memory::ArenaAllocator>::Append(stringBuilder,L'[');
  if ((this->super_ArrayObject).length < 10) {
    funcPtr.this = (JavascriptArray *)&funcPtr.stringBuilder;
    funcPtr.requestContext = &requestContext_local;
    __enterScriptObject.library = (JavascriptLibrary *)this;
    if (requestContext->threadContext->isScriptActive == false) {
      __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
      __entryExitRecord.scriptContext = (ScriptContext *)0x0;
      __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
      __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
      __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
      auStack_a8 = (undefined1  [8])0x0;
      __entryExitRecord._0_1_ = 0;
      __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
      __entryExitRecord._2_6_ = 0;
      EnterScriptObject::EnterScriptObject
                ((EnterScriptObject *)&__entryExitRecord.handledExceptionType,requestContext,
                 (ScriptEntryExitRecord *)auStack_a8,unaff_retaddr,&stack0x00000000,true,false,false
                );
      ScriptContext::OnScriptStart(requestContext,false,true);
      EnterScriptObject::VerifyEnterScript
                ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
      GetDiagValueString::anon_class_24_3_ff518c6f::operator()
                ((anon_class_24_3_ff518c6f *)&__enterScriptObject.library);
      EnterScriptObject::~EnterScriptObject
                ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
      stringBuilder = (StringBuilder<Memory::ArenaAllocator> *)requestContext_local;
    }
    else {
      GetDiagValueString::anon_class_24_3_ff518c6f::operator()
                ((anon_class_24_3_ff518c6f *)&__enterScriptObject.library);
      stringBuilder = (StringBuilder<Memory::ArenaAllocator> *)requestContext_local;
    }
  }
  else {
    StringBuilder<Memory::ArenaAllocator>::AppendCppLiteral<4ul>
              (stringBuilder,(char16 (*) [4])0xefb130);
  }
  StringBuilder<Memory::ArenaAllocator>::Append(stringBuilder,L']');
  return 1;
}

Assistant:

BOOL JavascriptArray::GetDiagValueString(StringBuilder<ArenaAllocator>* stringBuilder, ScriptContext* requestContext)
    {
        stringBuilder->Append(_u('['));

        if (this->length < 10)
        {
            auto funcPtr = [&]()
            {
                ENTER_PINNED_SCOPE(JavascriptString, valueStr);
                valueStr = JavascriptArray::JoinHelper(this, GetLibrary()->GetCommaDisplayString(), requestContext);
                stringBuilder->Append(valueStr->GetString(), valueStr->GetLength());
                LEAVE_PINNED_SCOPE();
            };

            if (!requestContext->GetThreadContext()->IsScriptActive())
            {
                BEGIN_JS_RUNTIME_CALL(requestContext);
                {
                    funcPtr();
                }
                END_JS_RUNTIME_CALL(requestContext);
            }
            else
            {
                funcPtr();
            }
        }
        else
        {
            stringBuilder->AppendCppLiteral(_u("..."));
        }

        stringBuilder->Append(_u(']'));

        return TRUE;
    }